

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pp.cpp
# Opt level: O0

TokenStream * __thiscall
glslang::TPpContext::PrescanMacroArg
          (TPpContext *this,TokenStream *arg,TPpToken *ppToken,bool newLineOkay)

{
  MacroExpandResult MVar1;
  tInput *in;
  int local_34;
  TokenStream *pTStack_30;
  int token;
  TokenStream *expandedArg;
  bool newLineOkay_local;
  TPpToken *ppToken_local;
  TokenStream *arg_local;
  TPpContext *this_local;
  
  pTStack_30 = (TokenStream *)::operator_new(0x28);
  TokenStream::TokenStream(pTStack_30);
  in = (tInput *)::operator_new(0x18);
  tMarkerInput::tMarkerInput((tMarkerInput *)in,this);
  pushInput(this,in);
  pushTokenStreamInput(this,arg,false,false);
  while (local_34 = scanToken(this,ppToken), local_34 != -3 && local_34 != -1) {
    local_34 = tokenPaste(this,local_34,ppToken);
    if ((local_34 != 0xa2) ||
       (MVar1 = MacroExpand(this,ppToken,false,newLineOkay), MVar1 == MacroExpandNotStarted))
    goto LAB_0079a47d;
    if (MVar1 == MacroExpandError) {
      do {
        local_34 = scanToken(this,ppToken);
      } while (local_34 != -3 && local_34 != -1);
      goto LAB_0079a47d;
    }
    if (1 < MVar1 - MacroExpandStarted) {
LAB_0079a47d:
      if ((local_34 == -3) || (local_34 == -1)) break;
      TokenStream::putToken(pTStack_30,local_34,ppToken);
    }
  }
  if (local_34 != -3) {
    if (pTStack_30 != (TokenStream *)0x0) {
      TokenStream::~TokenStream(pTStack_30);
      ::operator_delete(pTStack_30,0x28);
    }
    pTStack_30 = (TokenStream *)0x0;
  }
  return pTStack_30;
}

Assistant:

TPpContext::TokenStream* TPpContext::PrescanMacroArg(TokenStream& arg, TPpToken* ppToken, bool newLineOkay)
{
    // expand the argument
    TokenStream* expandedArg = new TokenStream;
    pushInput(new tMarkerInput(this));
    pushTokenStreamInput(arg);
    int token;
    while ((token = scanToken(ppToken)) != tMarkerInput::marker && token != EndOfInput) {
        token = tokenPaste(token, *ppToken);
        if (token == PpAtomIdentifier) {
            switch (MacroExpand(ppToken, false, newLineOkay)) {
            case MacroExpandNotStarted:
                break;
            case MacroExpandError:
                // toss the rest of the pushed-input argument by scanning until tMarkerInput
                while ((token = scanToken(ppToken)) != tMarkerInput::marker && token != EndOfInput)
                    ;
                break;
            case MacroExpandStarted:
            case MacroExpandUndef:
                continue;
            }
        }
        if (token == tMarkerInput::marker || token == EndOfInput)
            break;
        expandedArg->putToken(token, ppToken);
    }

    if (token != tMarkerInput::marker) {
        // Error, or MacroExpand ate the marker, so had bad input, recover
        delete expandedArg;
        expandedArg = nullptr;
    }

    return expandedArg;
}